

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O0

filepos_t UpdateDataSize(ebml_master *Element,bool_t bWithDefault,bool_t bForceWithoutMandatory,
                        int ForProfile)

{
  long lVar1;
  bool_t bVar2;
  filepos_t fVar3;
  void *pvVar4;
  ebml_element *local_38;
  ebml_element *i;
  int ForProfile_local;
  bool_t bForceWithoutMandatory_local;
  bool_t bWithDefault_local;
  ebml_master *Element_local;
  
  if (Element == (ebml_master *)0x0) {
    __assert_fail("(const void*)(Element)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0xd6,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
  }
  lVar1 = (**(code **)((long)(Element->Base).Base.Base.VMT + 0xa0))(Element,bWithDefault);
  if (lVar1 != 0) {
    if ((bForceWithoutMandatory == 0) &&
       (bVar2 = CheckMandatory(Element,bWithDefault,ForProfile), bVar2 == 0)) {
      __assert_fail("CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0xde,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
    }
    if (Element->CheckSumStatus == 0) {
      (Element->Base).DataSize = 0;
    }
    else {
      (Element->Base).DataSize = 6;
    }
    for (local_38 = (ebml_element *)(Element->Base).Base.Children; local_38 != (ebml_element *)0x0;
        local_38 = (ebml_element *)(local_38->Base).Next) {
      if (bWithDefault == 0) {
        if (local_38 == (ebml_element *)0x0) {
          __assert_fail("(const void*)(i)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0xe8,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
        }
        lVar1 = (**(code **)((long)(local_38->Base).Base.VMT + 0x88))(local_38);
        if (lVar1 == 0) goto LAB_001235fc;
      }
      else {
LAB_001235fc:
        if (local_38 == (ebml_element *)0x0) {
          __assert_fail("(const void*)(i)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0xea,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
        }
        (**(code **)((long)(local_38->Base).Base.VMT + 0x98))
                  (local_38,bWithDefault,bForceWithoutMandatory,ForProfile);
        if (local_38 == (ebml_element *)0x0) {
          __assert_fail("(const void*)(i)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0xeb,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
        }
        lVar1 = (**(code **)((long)(local_38->Base).Base.VMT + 0xa0))(local_38,bWithDefault);
        if (lVar1 != 0) {
          __assert_fail("!EBML_ElementNeedsDataSizeUpdate(i, bWithDefault)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0xeb,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
        }
        if (local_38->DataSize == -1) {
          return -1;
        }
        fVar3 = EBML_ElementFullSize(local_38,bWithDefault);
        (Element->Base).DataSize = fVar3 + (Element->Base).DataSize;
      }
      if (local_38 == (ebml_element *)(local_38->Base).Next) {
        __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                      ,0xe6,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
      }
    }
  }
  pvVar4 = Node_InheritedVMT((node *)Element,0x544d4245);
  fVar3 = (**(code **)((long)pvVar4 + 0x98))(Element,bWithDefault,bForceWithoutMandatory,ForProfile)
  ;
  return fVar3;
}

Assistant:

static filepos_t UpdateDataSize(ebml_master *Element, bool_t bWithDefault, bool_t bForceWithoutMandatory, int ForProfile)
{
    if (EBML_ElementNeedsDataSizeUpdate(Element, bWithDefault))
    {
        ebml_element *i;

	    //if (!EBML_ElementIsFiniteSize((ebml_element*)Element))
	    //	return INVALID_FILEPOS_T;

	    if (!bForceWithoutMandatory) {
		    assert(CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile));
        }

        if (Element->CheckSumStatus)
            Element->Base.DataSize = 6;
        else
    	    Element->Base.DataSize = 0;

        for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
        {
            if (!bWithDefault && EBML_ElementIsDefaultValue(i))
                continue;
            EBML_ElementUpdateSize(i,bWithDefault,bForceWithoutMandatory, ForProfile);
            assert(!EBML_ElementNeedsDataSizeUpdate(i, bWithDefault));
            if (i->DataSize == INVALID_FILEPOS_T)
                return INVALID_FILEPOS_T;
            Element->Base.DataSize += EBML_ElementFullSize(i,bWithDefault);
        }
#ifdef TODO
	    if (bChecksumUsed) {
		    Element->DataSize += EBML_ElementFullSize(Element->Checksum,bWithDefault);
	    }
#endif
    }

    return INHERITED(Element,ebml_element_vmt,EBML_MASTER_CLASS)->UpdateDataSize(Element, bWithDefault, bForceWithoutMandatory, ForProfile);
}